

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

QList<QTimeZonePrivate::Data> * __thiscall
QTzTimeZonePrivate::getPosixTransitions
          (QList<QTimeZonePrivate::Data> *__return_storage_ptr__,QTzTimeZonePrivate *this,
          qint64 msNear)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  qint64 qVar8;
  int iVar9;
  int iVar10;
  Data *pDVar11;
  int year;
  long in_FS_OFFSET;
  Data local_1b8;
  QTimeZone local_1b0;
  QDateTime local_1a8;
  Data local_1a0;
  Data local_198;
  Data local_190;
  QDateTime std;
  QDateTime dst;
  QArrayDataPointer<char> local_178;
  QArrayDataPointer<QByteArray> local_158;
  QArrayDataPointer<char> local_138;
  char *begin;
  QByteArray *pQStack_110;
  undefined1 *local_108;
  QArrayDataPointer<QByteArray> local_f8;
  qint64 local_e0;
  Data standard;
  Data saving;
  PosixZone local_78;
  Data local_58;
  char16_t *pcStack_50;
  long local_48;
  int local_40 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (Data)0x2;
  QDateTime::fromMSecsSinceEpoch((QDateTime *)&standard,msNear,(QTimeZone *)&local_58.s);
  saving.abbreviation.d.d = (Data *)QDateTime::date((QDateTime *)&standard);
  iVar6 = QDate::year((QDate *)&saving);
  QDateTime::~QDateTime((QDateTime *)&standard);
  QTimeZone::~QTimeZone((QTimeZone *)&local_58.s);
  lVar1 = (this->cached_data).m_tranTimes.d.size;
  if (lVar1 != 0) {
    msNear = (this->cached_data).m_tranTimes.d.ptr[lVar1 + -1].atMSecsSinceEpoch;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (Data *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  local_e0 = msNear;
  QByteArray::split((QList<QByteArray> *)&local_f8,&(this->cached_data).m_posixRule,',');
  local_40[0] = -0x80000000;
  local_40[1] = -0x55555556;
  local_48 = 0;
  local_58.d = (QTimeZonePrivate *)0x0;
  pcStack_50 = (char16_t *)0x0;
  local_78.offset = -0x80000000;
  local_78._28_4_ = 0xaaaaaaaa;
  local_78.name.d.d = (Data *)0x0;
  local_78.name.d.ptr = (char16_t *)0x0;
  local_78.name.d.size = 0;
  QByteArray::trimmed_helper((QByteArray *)&standard,local_f8.ptr);
  begin = (char *)standard.abbreviation.d.ptr;
  anon_unknown.dwarf_1242596::PosixZone::parse
            ((PosixZone *)&saving,&begin,
             (char *)((long)standard.abbreviation.d.ptr + standard.abbreviation.d.size));
  anon_unknown.dwarf_1242596::PosixZone::operator=((PosixZone *)&local_58.s,(PosixZone *)&saving);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&saving);
  if (begin < (char *)((long)standard.abbreviation.d.ptr + standard.abbreviation.d.size)) {
    anon_unknown.dwarf_1242596::PosixZone::parse
              ((PosixZone *)&saving,&begin,
               (char *)((long)standard.abbreviation.d.ptr + standard.abbreviation.d.size));
    anon_unknown.dwarf_1242596::PosixZone::operator=(&local_78,(PosixZone *)&saving);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&saving);
  }
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&standard);
  if ((undefined1 *)local_f8.size == (undefined1 *)0x1) {
    if (local_48 == 0) {
      QString::fromUtf8<void>(&saving.abbreviation,local_f8.ptr);
    }
    else {
      saving.abbreviation.d.d = (Data *)local_58.d;
      saving.abbreviation.d.ptr = pcStack_50;
      saving.abbreviation.d.size = local_48;
      if (local_58.d != (QTimeZonePrivate *)0x0) {
        LOCK();
        (((QArrayData *)&(local_58.d)->_vptr_QTimeZonePrivate)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&(local_58.d)->_vptr_QTimeZonePrivate)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    QList<QTimeZonePrivate::Data>::emplaceBack<QString,long_long&,int&,int&>
              (__return_storage_ptr__,&saving.abbreviation,&local_e0,local_40,local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&saving);
  }
  else if ((((undefined1 *)0x2 < (ulong)local_f8.size) && (local_f8.ptr[1].d.size != 0)) &&
          (local_f8.ptr[2].d.size != 0)) {
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    begin = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_110 = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    QByteArray::split((QList<QByteArray> *)&begin,local_f8.ptr + 1,'/');
    local_138.d = (pQStack_110->d).d;
    local_138.ptr = (pQStack_110->d).ptr;
    local_138.size = (pQStack_110->d).size;
    if (local_138.d != (Data *)0x0) {
      LOCK();
      ((local_138.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_138.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((undefined1 *)0x1 < local_108) {
      parsePosixTransitionTime(pQStack_110 + 1);
    }
    local_158.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_158.d._0_4_ = 0xaaaaaaaa;
    local_158.d._4_4_ = 0xaaaaaaaa;
    local_158.ptr._0_4_ = 0xaaaaaaaa;
    local_158.ptr._4_4_ = 0xaaaaaaaa;
    QByteArray::split((QList<QByteArray> *)&local_158,local_f8.ptr + 2,'/');
    plVar2 = (long *)CONCAT44(local_158.ptr._4_4_,local_158.ptr._0_4_);
    local_178.d = (Data *)*plVar2;
    local_178.ptr = (char *)plVar2[1];
    local_178.size = plVar2[2];
    if (local_178.d != (Data *)0x0) {
      LOCK();
      ((local_178.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_178.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((undefined1 *)0x1 < (ulong)local_158.size) {
      parsePosixTransitionTime
                ((QByteArray *)(CONCAT44(local_158.ptr._4_4_,local_158.ptr._0_4_) + 0x18));
    }
    if ((local_138.size == 0) || (local_178.size == 0)) {
LAB_003b43d8:
      bVar5 = true;
    }
    else {
      iVar10 = 0x116bd2d3;
      if (iVar6 < 0x116bd2d3) {
        iVar10 = iVar6;
      }
      iVar9 = -0x116bc36f;
      if (-0x116bc36f < iVar10) {
        iVar9 = iVar10;
      }
      iVar9 = iVar9 + -1;
      iVar10 = 0x116bd2d1;
      if (iVar6 < 0x116bd2d1) {
        iVar10 = iVar6;
      }
      iVar6 = -0x116bc371;
      if (-0x116bc371 < iVar10) {
        iVar6 = iVar10;
      }
      iVar10 = 0;
      bVar5 = false;
      do {
        year = iVar9 + iVar10;
        if (iVar6 + 1 < year) goto LAB_003b43d8;
        dst.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
        standard.abbreviation.d.d = (Data *)calculatePosixDate((QByteArray *)&local_138,year);
        std.d = (Data)(ShortData)0x2;
        QDate::startOfDay((QDate *)&saving,(QTimeZone *)&standard);
        QDateTime::addSecs(&dst,(qint64)&saving);
        QDateTime::~QDateTime((QDateTime *)&saving);
        QTimeZone::~QTimeZone((QTimeZone *)&std);
        saving._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        saving._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
        saving.abbreviation.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        saving.atMSecsSinceEpoch = (qint64)&DAT_aaaaaaaaaaaaaaaa;
        saving.abbreviation.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        saving.abbreviation.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        qVar8 = QDateTime::toMSecsSinceEpoch(&dst);
        QTimeZonePrivate::Data::Data
                  (&saving,&local_78.name,qVar8 + (long)local_40[0] * -1000,local_78.offset,
                   local_40[0]);
        std.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
        local_190.s = (ShortData)calculatePosixDate((QByteArray *)&local_178,year);
        local_198 = (Data)0x2;
        QDate::startOfDay((QDate *)&standard,(QTimeZone *)&local_190.s);
        QDateTime::addSecs(&std,(qint64)&standard);
        QDateTime::~QDateTime((QDateTime *)&standard);
        QTimeZone::~QTimeZone((QTimeZone *)&local_198.s);
        standard._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        standard._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
        standard.abbreviation.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        standard.atMSecsSinceEpoch = (qint64)&DAT_aaaaaaaaaaaaaaaa;
        standard.abbreviation.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        standard.abbreviation.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        qVar8 = QDateTime::toMSecsSinceEpoch(&std);
        QTimeZonePrivate::Data::Data
                  (&standard,(QString *)&local_58.s,qVar8 + (long)local_78.offset * -1000,
                   local_40[0],local_40[0]);
        if (iVar10 == 0) {
          if (standard.atMSecsSinceEpoch <= saving.atMSecsSinceEpoch) {
            QDate::QDate((QDate *)&local_198.s,iVar9,1,1);
            local_1a0 = (Data)0x2;
            QDate::startOfDay((QDate *)&local_190.s,(QTimeZone *)&local_198.s);
            bVar3 = operator<=(&std,(QDateTime *)&local_190.s);
            if (!bVar3) goto LAB_003b41b1;
            QDate::QDate((QDate *)&local_1b0,iVar9,0xc,0x1f);
            local_1b8 = (Data)0x2;
            QDate::endOfDay((QDate *)&local_1a8,&local_1b0);
            bVar3 = operator>=(&dst,&local_1a8);
            QDateTime::~QDateTime(&local_1a8);
            QTimeZone::~QTimeZone((QTimeZone *)&local_1b8.s);
            QDateTime::~QDateTime((QDateTime *)&local_190.s);
            QTimeZone::~QTimeZone((QTimeZone *)&local_1a0.s);
            if (bVar3) {
              standard.atMSecsSinceEpoch = local_e0;
              pDVar11 = &standard;
              goto LAB_003b4199;
            }
            goto LAB_003b41c5;
          }
          QDate::QDate((QDate *)&local_198.s,iVar9,1,1);
          local_1a0 = (Data)0x2;
          QDate::startOfDay((QDate *)&local_190.s,(QTimeZone *)&local_198.s);
          bVar3 = operator<=(&dst,(QDateTime *)&local_190.s);
          if (!bVar3) {
LAB_003b41b1:
            QDateTime::~QDateTime((QDateTime *)&local_190.s);
            QTimeZone::~QTimeZone((QTimeZone *)&local_1a0.s);
            goto LAB_003b41c5;
          }
          QDate::QDate((QDate *)&local_1b0,iVar9,0xc,0x1f);
          local_1b8 = (Data)0x2;
          QDate::endOfDay((QDate *)&local_1a8,&local_1b0);
          bVar3 = operator>=(&std,&local_1a8);
          QDateTime::~QDateTime(&local_1a8);
          QTimeZone::~QTimeZone((QTimeZone *)&local_1b8.s);
          QDateTime::~QDateTime((QDateTime *)&local_190.s);
          QTimeZone::~QTimeZone((QTimeZone *)&local_1a0.s);
          if (!bVar3) goto LAB_003b41c5;
          saving.atMSecsSinceEpoch = local_e0;
          pDVar11 = &saving;
LAB_003b4199:
          QList<QTimeZonePrivate::Data>::emplaceBack<QTimeZonePrivate::Data>
                    (__return_storage_ptr__,pDVar11);
          bVar5 = true;
          bVar4 = false;
        }
        else {
LAB_003b41c5:
          bVar3 = QDateTime::isValid(&std);
          if (bVar3) {
            local_190.s = (ShortData)QDateTime::date(&std);
            iVar7 = QDate::year((QDate *)&local_190.s);
            if (year != iVar7) goto LAB_003b4200;
            bVar3 = local_48 != 0;
          }
          else {
LAB_003b4200:
            bVar3 = false;
          }
          bVar4 = QDateTime::isValid(&dst);
          pDVar11 = &standard;
          if (bVar4) {
            local_190.s = (ShortData)QDateTime::date(&dst);
            iVar7 = QDate::year((QDate *)&local_190.s);
            if (year != iVar7) goto LAB_003b4272;
            if (bVar3 && local_78.name.d.size != 0) {
              bVar3 = ::operator<(&dst,&std);
              if (bVar3) {
                QList<QTimeZonePrivate::Data>::emplaceBack<QTimeZonePrivate::Data>
                          (__return_storage_ptr__,&saving);
              }
              else {
                QList<QTimeZonePrivate::Data>::emplaceBack<QTimeZonePrivate::Data>
                          (__return_storage_ptr__,&standard);
                pDVar11 = &saving;
              }
            }
            else {
              pDVar11 = &saving;
              if (bVar3) {
                pDVar11 = &standard;
              }
              bVar4 = true;
              if (local_78.name.d.size == 0 && !bVar3) goto LAB_003b4289;
            }
          }
          else {
LAB_003b4272:
            bVar4 = true;
            if (!bVar3) goto LAB_003b4289;
          }
          bVar4 = true;
          QList<QTimeZonePrivate::Data>::emplaceBack<QTimeZonePrivate::Data>
                    (__return_storage_ptr__,pDVar11);
        }
LAB_003b4289:
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&standard);
        QDateTime::~QDateTime(&std);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&saving);
        QDateTime::~QDateTime(&dst);
        iVar10 = iVar10 + 1;
      } while (bVar4);
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_178);
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_158);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_138);
    QArrayDataPointer<QByteArray>::~QArrayDataPointer((QArrayDataPointer<QByteArray> *)&begin);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58.s);
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_f8);
    if (!bVar5) {
      QArrayDataPointer<QTimeZonePrivate::Data>::~QArrayDataPointer(&__return_storage_ptr__->d);
    }
    goto LAB_003b43ac;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58.s);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_f8);
LAB_003b43ac:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QTimeZonePrivate::Data> QTzTimeZonePrivate::getPosixTransitions(qint64 msNear) const
{
    const int year = QDateTime::fromMSecsSinceEpoch(msNear, QTimeZone::UTC).date().year();
    // The Data::atMSecsSinceEpoch of the single entry if zone is constant:
    qint64 atTime = tranCache().isEmpty() ? msNear : tranCache().last().atMSecsSinceEpoch;
    return calculatePosixTransitions(cached_data.m_posixRule, year - 1, year + 1, atTime);
}